

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O0

bool P_MorphPlayer(player_t *activator,player_t *p,PClassPlayerPawn *spawntype,int duration,
                  int style,PClassActor *enter_flash,PClassActor *exit_flash)

{
  PType **ppPVar1;
  AActor *pAVar2;
  MetaClass *type;
  bool bVar3;
  uint uVar4;
  MetaClass *pMVar5;
  AInventory *pAVar6;
  MetaClass *pMVar7;
  APlayerPawn *pAVar8;
  PType *pPVar9;
  PClassActor *local_120;
  int local_114;
  AInventory *local_108;
  int local_d4;
  AHexenArmor *hxarmor;
  AInventory *next;
  DVector3 local_b0;
  AActor *local_98;
  AActor *eflash;
  undefined1 local_88 [4];
  TFlags<ActorFlag,_unsigned_int> local_84;
  TFlags<ActorRenderFlag,_unsigned_int> local_80;
  undefined1 local_7c [4];
  TFlags<ActorFlag,_unsigned_int> local_78;
  TFlags<ActorFlag2,_unsigned_int> local_74;
  DVector3 local_70;
  TFlags<ActorFlag2,_unsigned_int> local_58;
  TFlags<ActorFlag3,_unsigned_int> local_54;
  APlayerPawn *local_50;
  APlayerPawn *actor;
  APlayerPawn *morphed;
  AInventory *item;
  PClassActor *enter_flash_local;
  int style_local;
  int duration_local;
  PClassPlayerPawn *spawntype_local;
  player_t *p_local;
  player_t *activator_local;
  
  local_50 = p->mo;
  if (local_50 == (APlayerPawn *)0x0) {
    activator_local._7_1_ = false;
  }
  else {
    item = (AInventory *)enter_flash;
    enter_flash_local._0_4_ = (anon_union_4_2_12391d7c_for_PalEntry_0)style;
    enter_flash_local._4_4_ = duration;
    _style_local = spawntype;
    spawntype_local = (PClassPlayerPawn *)p;
    p_local = activator;
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_54,
               (int)local_50 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
    if (uVar4 == 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_58,
                 (int)(spawntype_local->super_PClassActor).super_PClass.super_PStruct.
                      super_PNamedType.super_PCompoundType.super_PType.super_DObject._vptr_DObject +
                 (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_58);
      if (uVar4 == 0 ||
          (player_t *)spawntype_local == p_local && (enter_flash_local._0_4_ & 0x40) != 0) {
        if (*(int *)&(spawntype_local->super_PClassActor).DeathHeight == 0) {
          if ((int)(spawntype_local->super_PClassActor).super_PClass.super_PStruct.Fields.Most < 1)
          {
            activator_local._7_1_ = false;
          }
          else if (_style_local == (MetaClass *)0x0) {
            activator_local._7_1_ = false;
          }
          else {
            bVar3 = PClass::IsDescendantOf
                              ((PClass *)_style_local,APlayerPawn::RegistrationInfo.MyClass);
            pMVar5 = _style_local;
            if (bVar3) {
              pMVar7 = APlayerPawn::GetClass
                                 (*(APlayerPawn **)
                                   &(spawntype_local->super_PClassActor).super_PClass.super_PStruct.
                                    super_PNamedType.super_PCompoundType.super_PType.super_DObject);
              type = _style_local;
              if (pMVar5 == pMVar7) {
                activator_local._7_1_ = false;
              }
              else {
                AActor::Pos(&local_70,&local_50->super_AActor);
                actor = (APlayerPawn *)Spawn(&type->super_PClassActor,&local_70,NO_REPLACE);
                pAVar6 = TObjPtr::operator_cast_to_AInventory_
                                   ((TObjPtr *)&(local_50->super_AActor).Inventory);
                EndAllPowerupEffects(pAVar6);
                DObject::StaticPointerSubstitution((DObject *)local_50,(DObject *)actor);
                bVar3 = false;
                if ((enter_flash_local._0_4_ & 0x4000) != 0) {
                  TFlags<ActorFlag2,_unsigned_int>::operator&
                            (&local_74,(int)actor + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
                  uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
                  bVar3 = uVar4 == 0;
                }
                if (bVar3) {
                  (actor->super_AActor).Translation = (local_50->super_AActor).Translation;
                }
                if (((local_50->super_AActor).tid != 0) && ((enter_flash_local._0_4_ & 0x100) != 0))
                {
                  (actor->super_AActor).tid = (local_50->super_AActor).tid;
                  AActor::AddToHash(&actor->super_AActor);
                  AActor::RemoveFromHash(&local_50->super_AActor);
                  (local_50->super_AActor).tid = 0;
                }
                TAngle<double>::operator=
                          (&(actor->super_AActor).Angles.Yaw,&(local_50->super_AActor).Angles.Yaw);
                (actor->super_AActor).target.field_0 = (local_50->super_AActor).target.field_0;
                (actor->super_AActor).tracer.field_0 = (local_50->super_AActor).tracer.field_0;
                TObjPtr<AActor>::operator=
                          (&(actor->super_AActor).alternative,&local_50->super_AActor);
                (actor->super_AActor).FriendPlayer = (local_50->super_AActor).FriendPlayer;
                (actor->super_AActor).DesignatedTeam = (local_50->super_AActor).DesignatedTeam;
                (actor->super_AActor).Score = (local_50->super_AActor).Score;
                TObjPtr<AWeapon>::operator=
                          ((TObjPtr<AWeapon> *)&(spawntype_local->super_PClassActor).FastSpeed,
                           *(AWeapon **)
                            &(spawntype_local->super_PClassActor).super_PClass.bRuntimeClass);
                pAVar2 = &local_50->super_AActor;
                operator~((EnumType)local_7c);
                TFlags<ActorFlag,_unsigned_int>::operator&(&local_78,&pAVar2->flags);
                uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_78);
                (actor->super_AActor).special2 = uVar4;
                (actor->super_AActor).player = (player_t *)spawntype_local;
                TFlags<ActorRenderFlag,_unsigned_int>::operator&(&local_80,(int)local_50 + 0xec);
                uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_80);
                if (uVar4 != 0) {
                  (actor->super_AActor).special2 = (actor->super_AActor).special2 | 0x40;
                }
                ppPVar1 = &(spawntype_local->super_PClassActor).super_PClass.super_PStruct.
                           super_PNamedType.super_PCompoundType.super_PType.PredType;
                if ((((double)*ppPVar1 <= actor->ViewHeight && actor->ViewHeight != (double)*ppPVar1
                     ) && (pPVar9 = (spawntype_local->super_PClassActor).super_PClass.super_PStruct.
                                    super_PNamedType.super_PCompoundType.super_PType.VisitNext,
                          (double)pPVar9 == 0.0)) && (!NAN((double)pPVar9))) {
                  pPVar9 = (PType *)player_t::GetDeltaViewHeight((player_t *)spawntype_local);
                  (spawntype_local->super_PClassActor).super_PClass.super_PStruct.super_PNamedType.
                  super_PCompoundType.super_PType.VisitNext = pPVar9;
                }
                pAVar2 = &local_50->super_AActor;
                operator|((EnumType)local_88,MF_SHADOW);
                TFlags<ActorFlag,_unsigned_int>::operator&(&local_84,&pAVar2->flags);
                TFlags<ActorFlag,_unsigned_int>::operator|=(&(actor->super_AActor).flags,&local_84);
                TFlags<ActorFlag2,_unsigned_int>::operator&
                          ((TFlags<ActorFlag2,_unsigned_int> *)((long)&eflash + 4),
                           (int)local_50 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
                TFlags<ActorFlag2,_unsigned_int>::operator|=
                          (&(actor->super_AActor).flags2,(Self *)((long)&eflash + 4));
                TFlags<ActorFlag3,_unsigned_int>::operator&
                          ((TFlags<ActorFlag3,_unsigned_int> *)&eflash,
                           (int)local_50 +
                           (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
                TFlags<ActorFlag3,_unsigned_int>::operator|=
                          (&(actor->super_AActor).flags3,(Self *)&eflash);
                if (item == (AInventory *)0x0) {
                  local_108 = (AInventory *)ATeleportFog::RegistrationInfo.MyClass;
                }
                else {
                  local_108 = item;
                }
                AActor::PosPlusZ(&local_b0,&local_50->super_AActor,gameinfo.telefogheight);
                local_98 = Spawn((PClassActor *)local_108,&local_b0,ALLOW_REPLACE);
                (local_50->super_AActor).player = (player_t *)0x0;
                TObjPtr<AActor>::operator=
                          (&(local_50->super_AActor).alternative,&actor->super_AActor);
                operator|((EnumType)&next,MF_SOLID);
                TFlags<ActorFlag,_unsigned_int>::operator~
                          ((TFlags<ActorFlag,_unsigned_int> *)((long)&next + 4));
                TFlags<ActorFlag,_unsigned_int>::operator&=
                          (&(local_50->super_AActor).flags,(Self *)((long)&next + 4));
                TFlags<ActorFlag,_unsigned_int>::operator|=
                          (&(local_50->super_AActor).flags,MF_UNMORPHED);
                TFlags<ActorRenderFlag,_unsigned_int>::operator|=
                          (&(local_50->super_AActor).renderflags,RF_INVISIBLE);
                if (enter_flash_local._4_4_ == 0) {
                  local_114 = 0x578;
                }
                else {
                  local_114 = enter_flash_local._4_4_;
                }
                *(int *)&(spawntype_local->super_PClassActor).DeathHeight = local_114;
                (spawntype_local->super_PClassActor).BurnHeight = (double)_style_local;
                (spawntype_local->super_PClassActor).BloodColor.field_0 = enter_flash_local._0_4_;
                if (exit_flash == (PClassActor *)0x0) {
                  local_120 = (PClassActor *)ATeleportFog::RegistrationInfo.MyClass;
                }
                else {
                  local_120 = exit_flash;
                }
                *(PClassActor **)&(spawntype_local->super_PClassActor).WoundHealth = local_120;
                (spawntype_local->super_PClassActor).super_PClass.super_PStruct.Fields.Most =
                     (actor->super_AActor).health;
                *(APlayerPawn **)
                 &(spawntype_local->super_PClassActor).super_PClass.super_PStruct.super_PNamedType.
                  super_PCompoundType.super_PType.super_DObject = actor;
                *(undefined8 *)
                 &(spawntype_local->super_PClassActor).super_PClass.super_PStruct.super_PNamedType.
                  TypeName = 0;
                (spawntype_local->super_PClassActor).super_PClass.super_PStruct.super_PNamedType.
                Outer = (DObject *)0x0;
                AActor::ObtainInventory(&actor->super_AActor,&local_50->super_AActor);
                pAVar8 = (APlayerPawn *)
                         TObjPtr::operator_cast_to_AInventory_
                                   ((TObjPtr *)&(actor->super_AActor).Inventory);
                while (morphed = pAVar8, morphed != (APlayerPawn *)0x0) {
                  pAVar8 = (APlayerPawn *)
                           TObjPtr::operator_cast_to_AInventory_
                                     ((TObjPtr *)&(morphed->super_AActor).Inventory);
                  bVar3 = DObject::IsKindOf((DObject *)morphed,AArmor::RegistrationInfo.MyClass);
                  if (bVar3) {
                    bVar3 = DObject::IsKindOf((DObject *)morphed,
                                              AHexenArmor::RegistrationInfo.MyClass);
                    if (bVar3) {
                      morphed->ViewHeight = 0.0;
                      morphed->ForwardMove1 = 0.0;
                      morphed->ForwardMove2 = 0.0;
                      morphed->SideMove1 = 0.0;
                      morphed->SideMove2 = _style_local->HexenArmor[0];
                    }
                    else {
                      (*(morphed->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])();
                    }
                  }
                }
                pAVar6 = TObjPtr::operator_cast_to_AInventory_
                                   ((TObjPtr *)&(actor->super_AActor).Inventory);
                InitAllPowerupEffects(pAVar6);
                (*(actor->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2a])();
                bVar3 = TObjPtr<AActor>::operator==
                                  ((TObjPtr<AActor> *)
                                   &(spawntype_local->super_PClassActor).HowlSound,
                                   &local_50->super_AActor);
                if (bVar3) {
                  TObjPtr<AActor>::operator=
                            ((TObjPtr<AActor> *)&(spawntype_local->super_PClassActor).HowlSound,
                             &actor->super_AActor);
                }
                (actor->ScoreIcon).texnum = (local_50->ScoreIcon).texnum;
                if (local_98 != (AActor *)0x0) {
                  TObjPtr<AActor>::operator=
                            (&local_98->target,
                             *(AActor **)
                              &(spawntype_local->super_PClassActor).super_PClass.super_PStruct.
                               super_PNamedType.super_PCompoundType.super_PType.super_DObject);
                }
                activator_local._7_1_ = true;
              }
            }
            else {
              activator_local._7_1_ = false;
            }
          }
        }
        else {
          pMVar5 = APlayerPawn::GetClass
                             (*(APlayerPawn **)
                               &(spawntype_local->super_PClassActor).super_PClass.super_PStruct.
                                super_PNamedType.super_PCompoundType.super_PType.super_DObject);
          if ((pMVar5 == _style_local) &&
             ((*(uint *)(*(long *)&(spawntype_local->super_PClassActor).super_PClass.super_PStruct.
                                   super_PNamedType.super_PCompoundType.super_PType.super_DObject +
                        0x4ac) & 2) != 0)) {
            if (enter_flash_local._4_4_ == 0) {
              local_d4 = 0x578;
            }
            else {
              local_d4 = enter_flash_local._4_4_;
            }
            if ((*(int *)&(spawntype_local->super_PClassActor).DeathHeight < local_d4 + -0x23) &&
               (pAVar6 = AActor::FindInventory
                                   (*(AActor **)
                                     &(spawntype_local->super_PClassActor).super_PClass.
                                      super_PStruct.super_PNamedType.super_PCompoundType.super_PType
                                      .super_DObject,
                                    (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true
                                   ), pAVar6 == (AInventory *)0x0)) {
              AActor::GiveInventoryType
                        (*(AActor **)
                          &(spawntype_local->super_PClassActor).super_PClass.super_PStruct.
                           super_PNamedType.super_PCompoundType.super_PType.super_DObject,
                         (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass);
            }
          }
          activator_local._7_1_ = false;
        }
      }
      else {
        activator_local._7_1_ = false;
      }
    }
    else {
      activator_local._7_1_ = false;
    }
  }
  return activator_local._7_1_;
}

Assistant:

bool P_MorphPlayer (player_t *activator, player_t *p, PClassPlayerPawn *spawntype, int duration, int style, PClassActor *enter_flash, PClassActor *exit_flash)
{
	AInventory *item;
	APlayerPawn *morphed;
	APlayerPawn *actor;

	actor = p->mo;
	if (actor == nullptr)
	{
		return false;
	}
	if (actor->flags3 & MF3_DONTMORPH)
	{
		return false;
	}
	if ((p->mo->flags2 & MF2_INVULNERABLE) && ((p != activator) || (!(style & MORPH_WHENINVULNERABLE))))
	{ // Immune when invulnerable unless this is a power we activated
		return false;
	}
	if (p->morphTics)
	{ // Player is already a beast
		if ((p->mo->GetClass() == spawntype)
			&& (p->mo->PlayerFlags & PPF_CANSUPERMORPH)
			&& (p->morphTics < (((duration) ? duration : MORPHTICS) - TICRATE))
			&& (p->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true) == nullptr))
		{ // Make a super chicken
			p->mo->GiveInventoryType (RUNTIME_CLASS(APowerWeaponLevel2));
		}
		return false;
	}
	if (p->health <= 0)
	{ // Dead players cannot morph
		return false;
	}
	if (spawntype == nullptr)
	{
		return false;
	}
	if (!spawntype->IsDescendantOf (RUNTIME_CLASS(APlayerPawn)))
	{
		return false;
	}
	if (spawntype == p->mo->GetClass())
	{
		return false;
	}

	morphed = static_cast<APlayerPawn *>(Spawn (spawntype, actor->Pos(), NO_REPLACE));
	EndAllPowerupEffects(actor->Inventory);
	DObject::StaticPointerSubstitution (actor, morphed);
	if ((style & MORPH_TRANSFERTRANSLATION) && !(morphed->flags2 & MF2_DONTTRANSLATE))
	{
		morphed->Translation = actor->Translation;
	}
	if ((actor->tid != 0) && (style & MORPH_NEWTIDBEHAVIOUR))
	{
		morphed->tid = actor->tid;
		morphed->AddToHash ();
		actor->RemoveFromHash ();
		actor->tid = 0;
	}
	morphed->Angles.Yaw = actor->Angles.Yaw;
	morphed->target = actor->target;
	morphed->tracer = actor->tracer;
	morphed->alternative = actor;
	morphed->FriendPlayer = actor->FriendPlayer;
	morphed->DesignatedTeam = actor->DesignatedTeam;
	morphed->Score = actor->Score;
	p->PremorphWeapon = p->ReadyWeapon;
	morphed->special2 = actor->flags & ~MF_JUSTHIT;
	morphed->player = p;
	if (actor->renderflags & RF_INVISIBLE)
	{
		morphed->special2 |= MF_JUSTHIT;
	}
	if (morphed->ViewHeight > p->viewheight && p->deltaviewheight == 0)
	{ // If the new view height is higher than the old one, start moving toward it.
		p->deltaviewheight = p->GetDeltaViewHeight();
	}
	morphed->flags  |= actor->flags & (MF_SHADOW|MF_NOGRAVITY);
	morphed->flags2 |= actor->flags2 & MF2_FLY;
	morphed->flags3 |= actor->flags3 & MF3_GHOST;
	AActor *eflash = Spawn(((enter_flash) ? enter_flash : RUNTIME_CLASS(ATeleportFog)), actor->PosPlusZ(TELEFOGHEIGHT), ALLOW_REPLACE);
	actor->player = nullptr;
	actor->alternative = morphed;
	actor->flags &= ~(MF_SOLID|MF_SHOOTABLE);
	actor->flags |= MF_UNMORPHED;
	actor->renderflags |= RF_INVISIBLE;
	p->morphTics = (duration) ? duration : MORPHTICS;

	// [MH] Used by SBARINFO to speed up face drawing
	p->MorphedPlayerClass = spawntype;

	p->MorphStyle = style;
	p->MorphExitFlash = (exit_flash) ? exit_flash : RUNTIME_CLASS(ATeleportFog);
	p->health = morphed->health;
	p->mo = morphed;
	p->Vel.X = p->Vel.Y = 0;
	morphed->ObtainInventory (actor);
	// Remove all armor
	for (item = morphed->Inventory; item != nullptr; )
	{
		AInventory *next = item->Inventory;
		if (item->IsKindOf (RUNTIME_CLASS(AArmor)))
		{
			if (item->IsKindOf (RUNTIME_CLASS(AHexenArmor)))
			{
				// Set the HexenArmor slots to 0, except the class slot.
				AHexenArmor *hxarmor = static_cast<AHexenArmor *>(item);
				hxarmor->Slots[0] = 0;
				hxarmor->Slots[1] = 0;
				hxarmor->Slots[2] = 0;
				hxarmor->Slots[3] = 0;
				hxarmor->Slots[4] = spawntype->HexenArmor[0];
			}
			else
			{
				item->DepleteOrDestroy();
			}
		}
		item = next;
	}
	InitAllPowerupEffects(morphed->Inventory);
	morphed->ActivateMorphWeapon ();
	if (p->camera == actor)
	{
		p->camera = morphed;
	}
	morphed->ScoreIcon = actor->ScoreIcon;	// [GRB]
	if (eflash)	
		eflash->target = p->mo;
	return true;
}